

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

int Gia_ManSimRelCollectOutputs
              (Gia_Man_t *p,int nWords,Vec_Wrd_t *vSims,int nWordsOut,Vec_Wrd_t *vSimsOut,
              Vec_Wrd_t *vRel)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint iPat;
  int iMint;
  uint uVar7;
  int CountMints;
  int iVar8;
  
  iVar1 = nWords / nWordsOut;
  if (vSims->nSize != p->nObjs * nWords) {
    __assert_fail("Vec_WrdSize(vSims) == nWords * Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x2b8,
                  "int Gia_ManSimRelCollectOutputs(Gia_Man_t *, int, Vec_Wrd_t *, int, Vec_Wrd_t *, Vec_Wrd_t *)"
                 );
  }
  if (vSimsOut->nSize == p->vCos->nSize * nWordsOut) {
    if (vRel->nSize == iVar1 * nWordsOut) {
      uVar3 = nWordsOut << 6;
      iVar4 = 0;
      iVar5 = 0;
      if (0 < iVar1) {
        iVar5 = iVar1;
      }
      uVar6 = 0;
      if (0 < (int)uVar3) {
        uVar6 = uVar3;
      }
      uVar7 = 0;
      for (iPat = 0; iPat != uVar6; iPat = iPat + 1) {
        iVar8 = 0;
        for (iMint = 0; iVar5 != iMint; iMint = iMint + 1) {
          iVar2 = Gia_ManSimRelCompare(p,nWords,vSims,nWordsOut,vSimsOut,iPat,iMint);
          if (iVar2 != 0) {
            vRel->pArray[iVar4 + iMint >> 6] =
                 vRel->pArray[iVar4 + iMint >> 6] | 1L << ((byte)(iVar4 + iMint) & 0x3f);
            iVar8 = iVar8 + 1;
          }
        }
        uVar7 = uVar7 + (iVar8 == 0);
        iVar4 = iVar4 + iVar1;
      }
      if (uVar7 != 0) {
        printf("The relation is not well-defined for %d (out of %d) patterns.\n",(ulong)uVar7,
               (ulong)uVar3);
      }
      return uVar7;
    }
    __assert_fail("Vec_WrdSize(vRel) == nWordsOut * nMints",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x2ba,
                  "int Gia_ManSimRelCollectOutputs(Gia_Man_t *, int, Vec_Wrd_t *, int, Vec_Wrd_t *, Vec_Wrd_t *)"
                 );
  }
  __assert_fail("Vec_WrdSize(vSimsOut) == nWordsOut * Gia_ManCoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x2b9,
                "int Gia_ManSimRelCollectOutputs(Gia_Man_t *, int, Vec_Wrd_t *, int, Vec_Wrd_t *, Vec_Wrd_t *)"
               );
}

Assistant:

int Gia_ManSimRelCollectOutputs( Gia_Man_t * p, int nWords, Vec_Wrd_t * vSims, int nWordsOut, Vec_Wrd_t * vSimsOut, Vec_Wrd_t * vRel )
{
    int i, m, nMints = nWords / nWordsOut, Count = 0;
    assert( Vec_WrdSize(vSims)    == nWords   * Gia_ManObjNum(p) );
    assert( Vec_WrdSize(vSimsOut) == nWordsOut * Gia_ManCoNum(p) );
    assert( Vec_WrdSize(vRel)     == nWordsOut * nMints );
    for ( i = 0; i < 64 * nWordsOut; i++ )
    {
        int CountMints = 0;
        for ( m = 0; m < nMints; m++ )
            if ( Gia_ManSimRelCompare(p, nWords, vSims, nWordsOut, vSimsOut, i, m) )
                Abc_TtSetBit( Vec_WrdArray(vRel), i*nMints+m ), CountMints++;
        Count += CountMints == 0;
    }
    if ( Count )
        printf( "The relation is not well-defined for %d (out of %d) patterns.\n", Count, 64 * nWordsOut );
    return Count;
}